

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

bool cppnet::CheckConnect(uint64_t sock)

{
  int iVar1;
  socklen_t len;
  int32_t ret;
  socklen_t local_10;
  int local_c;
  
  local_c = 0;
  local_10 = 4;
  iVar1 = getsockopt((int)sock,1,4,&local_c,&local_10);
  return local_c == 0 && iVar1 != -1;
}

Assistant:

bool CheckConnect(const uint64_t sock) {
    /*struct pollfd fd;
    int32_t ret = 0;
    socklen_t len = 0;
    fd.fd = sock;
    fd.events = POLLOUT;
    if (poll(&fd, 1, 20000) == -1) {
        if(errno != EINTR){
            return false;
        }
    }*/
    int32_t ret = 0;
    socklen_t len = sizeof(ret);
    if (getsockopt(sock, SOL_SOCKET, SO_ERROR, &ret, &len) == -1) {
        return false;
    }
    if(ret != 0) {
        return false;
    }
    return true;
}